

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O3

bool crn_decompress_block(void *pSrc_block,crn_uint32 *pDst_pixels_u32,crn_format crn_fmt)

{
  uchar uVar1;
  byte bVar2;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  crn_format cVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar14;
  dxt1_block *pDXT1_block;
  uint i_2;
  color_quad_u8 colors [4];
  color_quad_u8 colors_2 [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aaStack_68 [8];
  color_quad_u8 local_48 [8];
  
  cVar8 = crnd::crnd_get_fundamental_dxt_format(crn_fmt);
  bVar5 = false;
  switch(cVar8) {
  case cCRNFmtDXT1:
    crnlib::dxt1_block::get_block_colors
              ((color_quad_u8 *)&aaStack_68[0].field_0,*pSrc_block,*(uint16 *)((long)pSrc_block + 2)
              );
    bVar4 = 0;
    uVar10 = 0;
    do {
      *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)(pDst_pixels_u32 + uVar10) =
           aaStack_68
           [*(byte *)((long)pSrc_block + (uVar10 >> 2 & 0x3fffffff) + 4) >> (bVar4 & 6) & 3];
      uVar10 = uVar10 + 1;
      bVar4 = bVar4 + 2;
    } while (uVar10 != 0x10);
    break;
  case cCRNFmtDXT3:
    crnlib::dxt1_block::get_block_colors
              ((color_quad_u8 *)&aaStack_68[0].field_0,*(uint16 *)((long)pSrc_block + 8),
               *(uint16 *)((long)pSrc_block + 10));
    uVar10 = 0;
    do {
      uVar6 = (uint)uVar10 & 3;
      uVar11 = uVar10 >> 2 & 0x3fffffff;
      uVar9 = *(byte *)((long)pSrc_block + uVar11 + 0xc) >> (char)uVar6 * '\x02' & 3;
      uVar7 = crnlib::dxt3_block::get_alpha((dxt3_block *)pSrc_block,uVar6,(uint)uVar11,true);
      *(uchar *)(pDst_pixels_u32 + uVar10) = aaStack_68[uVar9].field_0.r;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = aaStack_68[uVar9].field_0.g;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = aaStack_68[uVar9].field_0.b;
      *(char *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = (char)uVar7;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x10);
    break;
  case cCRNFmtDXT5:
    crnlib::dxt1_block::get_block_colors
              (local_48,*(uint16 *)((long)pSrc_block + 8),*(uint16 *)((long)pSrc_block + 10));
    crnlib::dxt5_block::get_block_values
              ((uint *)aaStack_68[0].c,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    bVar4 = 0;
    uVar6 = 0;
    uVar10 = 0;
    do {
      bVar2 = *(byte *)((long)pSrc_block + (ulong)(uVar6 >> 3) + 2);
      uVar9 = (uint)bVar2;
      if (uVar10 < 0xe) {
        uVar9 = (uint)CONCAT11(*(undefined1 *)((long)pSrc_block + (ulong)(uVar6 >> 3) + 3),bVar2);
      }
      uVar12 = *(byte *)((long)pSrc_block + (uVar10 >> 2 & 0x3fffffff) + 0xc) >> (bVar4 & 6) & 3;
      *(uchar *)(pDst_pixels_u32 + uVar10) = local_48[uVar12].field_0.field_0.r;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = local_48[uVar12].field_0.field_0.g;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = local_48[uVar12].field_0.field_0.b;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) =
           aaStack_68[uVar9 >> ((byte)uVar6 & 7) & 7].field_0.r;
      uVar10 = uVar10 + 1;
      uVar6 = uVar6 + 3;
      bVar4 = bVar4 + 2;
    } while (uVar10 != 0x10);
  case cCRNFmtDXN_XY:
  case cCRNFmtDXN_YX:
    crnlib::dxt5_block::get_block_values
              ((uint *)aaStack_68[0].c,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    crnlib::dxt5_block::get_block_values
              ((uint *)local_48,(uint)*(byte *)((long)pSrc_block + 8),
               (uint)*(byte *)((long)pSrc_block + 9));
    paVar14 = aaStack_68;
    paVar3 = &local_48[0].field_0;
    if (crn_fmt == cCRNFmtDXN_XY) {
      paVar14 = &local_48[0].field_0;
      paVar3 = aaStack_68;
    }
    uVar6 = 0;
    uVar10 = 0;
    do {
      uVar11 = (ulong)(uVar6 >> 3);
      bVar4 = *(byte *)((long)pSrc_block + uVar11 + 2);
      bVar2 = (byte)uVar6;
      if (uVar10 < 0xe) {
        uVar9 = (uint)(ushort)(CONCAT11(*(undefined1 *)((long)pSrc_block + uVar11 + 3),bVar4) >>
                              (bVar2 & 7));
        uVar12 = (uint)*(ushort *)((long)pSrc_block + uVar11 + 10);
      }
      else {
        uVar9 = (uint)(bVar4 >> (bVar2 & 7));
        uVar12 = (uint)*(byte *)((long)pSrc_block + uVar11 + 10);
      }
      uVar13 = uVar12 >> (bVar2 & 7) & 7;
      uVar12 = uVar13;
      if (crn_fmt == cCRNFmtDXN_XY) {
        uVar12 = uVar9 & 7;
      }
      if (crn_fmt != cCRNFmtDXN_XY) {
        uVar13 = uVar9 & 7;
      }
      uVar1 = ((color_quad_u8 *)paVar14)[uVar13].field_0.field_0.r;
      *(uchar *)(pDst_pixels_u32 + uVar10) = ((color_quad_u8 *)paVar3)[uVar12].field_0.field_0.r;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = uVar1;
      *(undefined2 *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = 0xffff;
      uVar10 = uVar10 + 1;
      uVar6 = uVar6 + 3;
    } while (uVar10 != 0x10);
    break;
  default:
    goto switchD_0014d447_caseD_3;
  case cCRNFmtDXT5A:
    crnlib::dxt5_block::get_block_values
              ((uint *)aaStack_68[0].c,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    uVar6 = 0;
    uVar10 = 0;
    do {
      bVar4 = *(byte *)((long)pSrc_block + (ulong)(uVar6 >> 3) + 2);
      uVar9 = (uint)bVar4;
      if (uVar10 < 0xe) {
        uVar9 = (uint)CONCAT11(*(undefined1 *)((long)pSrc_block + (ulong)(uVar6 >> 3) + 3),bVar4);
      }
      uVar1 = aaStack_68[uVar9 >> ((byte)uVar6 & 7) & 7].field_0.r;
      *(undefined2 *)(pDst_pixels_u32 + uVar10) = 0xffff;
      *(undefined1 *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = 0xff;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = uVar1;
      uVar10 = uVar10 + 1;
      uVar6 = uVar6 + 3;
    } while (uVar10 != 0x10);
    break;
  case cCRNFmtETC1:
    crnlib::unpack_etc1((etc1_block *)pSrc_block,(color_quad_u8 *)pDst_pixels_u32,false);
  }
  bVar5 = true;
switchD_0014d447_caseD_3:
  return bVar5;
}

Assistant:

bool crn_decompress_block(const void* pSrc_block, crn_uint32* pDst_pixels_u32, crn_format crn_fmt)
{
    color_quad_u8* pDst_pixels = reinterpret_cast<color_quad_u8*>(pDst_pixels_u32);

    switch (crn_get_fundamental_dxt_format(crn_fmt))
    {
    case cCRNFmtETC1:
    {
        const etc1_block& block = *reinterpret_cast<const etc1_block*>(pSrc_block);
        unpack_etc1(block, pDst_pixels, false);
        break;
    }
    case cCRNFmtDXT1:
    {
        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block);

        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
        }

        break;
    }

    case cCRNFmtDXT3:
    {
        const dxt3_block* pDXT3_block = reinterpret_cast<const dxt3_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT3_block->get_alpha(i & 3, i >> 2, true);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(a);
        }

        break;
    }

    case cCRNFmtDXT5:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(values[a]);
        }
    }

    case cCRNFmtDXN_XY:
    case cCRNFmtDXN_YX:
    {
        const dxt5_block* pDXT5_block0 = reinterpret_cast<const dxt5_block*>(pSrc_block);
        const dxt5_block* pDXT5_block1 = reinterpret_cast<const dxt5_block*>(pSrc_block) + 1;

        uint values0[cDXT5SelectorValues];
        dxt5_block::get_block_values(values0, pDXT5_block0->get_low_alpha(), pDXT5_block0->get_high_alpha());

        uint values1[cDXT5SelectorValues];
        dxt5_block::get_block_values(values1, pDXT5_block1->get_low_alpha(), pDXT5_block1->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s0 = pDXT5_block0->get_selector(i & 3, i >> 2);
            const uint s1 = pDXT5_block1->get_selector(i & 3, i >> 2);

            if (crn_fmt == cCRNFmtDXN_XY)
            {
                pDst_pixels[i].set_noclamp_rgba(values0[s0], values1[s1], 255, 255);
            }
            else
            {
                pDst_pixels[i].set_noclamp_rgba(values1[s1], values0[s0], 255, 255);
            }
        }
        
        break;
    }

    case cCRNFmtDXT5A:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i].set_noclamp_rgba(255, 255, 255, values[s]);
        }

        break;
    }
    default:
    {
        return false;
    }
    }

    return true;
}